

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

double __thiscall
wasm::Random::
pick<double,double,float,float,double,double,int,int,long,long,unsigned_int,unsigned_long>
          (Random *this,double first,double args,float args_1,float args_2,double args_3,
          double args_4,int args_5,int args_6,long args_7,long args_8,uint args_9,
          unsigned_long args_10)

{
  uint32_t uVar1;
  double dVar2;
  
  uVar1 = upTo(this,0xc);
  dVar2 = pickGivenNum<double,double,float,float,double,double,int,int,long,long,unsigned_int,unsigned_long>
                    (this,(ulong)uVar1,first,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,
                     args_8,args_9,args_10);
  return dVar2;
}

Assistant:

T pick(T first, Args... args) {
    auto num = sizeof...(Args) + 1;
    auto temp = upTo(num);
    return pickGivenNum<T>(temp, first, args...);
  }